

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-test.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  
  iVar1 = microatf_tp_main(argc,argv,microatf_tp_add_tcs);
  return iVar1;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, atf__environment);
	ATF_TP_ADD_TC(tp, atf__timeout);
	ATF_TP_ADD_TC(tp, atf__checkfail);
	ATF_TP_ADD_TC(tp, atf__exit_code);
	ATF_TP_ADD_TC(tp, atf__signal);

	return atf_no_error();
}